

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

void main_test_output(void)

{
  PortMidiStream *pPVar1;
  int outputDevice;
  PtTimestamp PVar2;
  PtTimestamp PVar3;
  code *time_proc;
  long lVar4;
  PortMidiStream *midi;
  PmEvent buffer [5];
  char line [80];
  PortMidiStream *local_c0;
  PmEvent local_b8 [6];
  char local_88 [88];
  
  outputDevice = get_number("Type output number: ");
  lVar4 = 0;
  Pt_Start(1,(PtCallback *)0x0,(void *)0x0);
  time_proc = (PmTimeProcPtr)0x0;
  if (latency != 0) {
    time_proc = Pt_Time;
  }
  Pm_OpenOutput(&local_c0,outputDevice,(void *)0x0,0,time_proc,(void *)0x0,latency);
  printf("Midi Output opened with %ld ms latency.\n",(long)latency);
  printf("ready to send program 1 change... (type RETURN):");
  fgets(local_88,0x50,_stdin);
  local_b8[0].timestamp = Pt_Time();
  local_b8[0].message = 0xc0;
  Pm_Write(local_c0,local_b8,1);
  printf("ready to note-on... (type RETURN):");
  fgets(local_88,0x50,_stdin);
  local_b8[0].timestamp = Pt_Time();
  local_b8[0].message = 0x643c90;
  Pm_Write(local_c0,local_b8,1);
  printf("ready to note-off... (type RETURN):");
  fgets(local_88,0x50,_stdin);
  local_b8[0].timestamp = Pt_Time();
  local_b8[0].message = 0x3c90;
  Pm_Write(local_c0,local_b8,1);
  printf("ready to note-on (short form)... (type RETURN):");
  fgets(local_88,0x50,_stdin);
  pPVar1 = local_c0;
  PVar2 = Pt_Time();
  Pm_WriteShort(pPVar1,PVar2,0x643c90);
  printf("ready to note-off (short form)... (type RETURN):");
  fgets(local_88,0x50,_stdin);
  pPVar1 = local_c0;
  PVar2 = Pt_Time();
  Pm_WriteShort(pPVar1,PVar2,0x3c90);
  puts("chord will arpeggiate if latency > 0");
  printf("ready to chord-on/chord-off... (type RETURN):");
  fgets(local_88,0x50,_stdin);
  PVar3 = Pt_Time();
  PVar2 = PVar3;
  do {
    *(PtTimestamp *)((long)&local_b8[0].timestamp + lVar4 * 2) = PVar2;
    *(uint *)((long)&local_b8[0].message + lVar4 * 2) =
         (*(uint *)((long)&DAT_00106030 + lVar4) & 0x64ff) << 8 | 0x640090;
    PVar2 = PVar2 + 1000;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x14);
  Pm_Write(local_c0,local_b8,5);
  do {
    PVar2 = Pt_Time();
  } while (PVar2 < PVar3 + 6000);
  lVar4 = 0;
  do {
    *(PtTimestamp *)((long)&local_b8[0].timestamp + lVar4 * 2) = PVar3;
    *(uint *)((long)&local_b8[0].message + lVar4 * 2) =
         (*(uint *)((long)&DAT_00106030 + lVar4) & 0xff) << 8 | 0x90;
    PVar3 = PVar3 + 1000;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x14);
  Pm_Write(local_c0,local_b8,5);
  printf("ready to close and terminate... (type RETURN):");
  fgets(local_88,0x50,_stdin);
  Pm_Close(local_c0);
  Pm_Terminate();
  puts("done closing and terminating...");
  return;
}

Assistant:

void main_test_output() {
    PmStream * midi;
	char line[80];
    int32_t off_time;
    int chord[] = { 60, 67, 76, 83, 90 };
    #define chord_size 5 
    PmEvent buffer[chord_size];
    PmTimestamp timestamp;

    /* determine which output device to use */
    int i = get_number("Type output number: ");

    /* It is recommended to start timer before PortMidi */
    TIME_START;

    /* open output device -- since PortMidi avoids opening a timer
       when latency is zero, we will pass in a NULL timer pointer
       for that case. If PortMidi tries to access the time_proc,
       we will crash, so this test will tell us something. */
    Pm_OpenOutput(&midi, 
                  i, 
                  DRIVER_INFO,
                  OUTPUT_BUFFER_SIZE, 
                  (latency == 0 ? NULL : TIME_PROC),
                  (latency == 0 ? NULL : TIME_INFO), 
                  latency);
    printf("Midi Output opened with %ld ms latency.\n", (long) latency);

    /* output note on/off w/latency offset; hold until user prompts */
    printf("ready to send program 1 change... (type RETURN):");
    fgets(line, STRING_MAX, stdin);
    /* if we were writing midi for immediate output, we could always use
       timestamps of zero, but since we may be writing with latency, we
       will explicitly set the timestamp to "now" by getting the time.
       The source of timestamps should always correspond to the TIME_PROC
       and TIME_INFO parameters used in Pm_OpenOutput(). */
    buffer[0].timestamp = TIME_PROC(TIME_INFO);
    /* Send a program change to increase the chances we will hear notes */
    /* Program 0 is usually a piano, but you can change it here: */
#define PROGRAM 0
    buffer[0].message = Pm_Message(0xC0, PROGRAM, 0);
    Pm_Write(midi, buffer, 1);

    printf("ready to note-on... (type RETURN):");
    fgets(line, STRING_MAX, stdin);
    buffer[0].timestamp = TIME_PROC(TIME_INFO);
    buffer[0].message = Pm_Message(0x90, 60, 100);
    Pm_Write(midi, buffer, 1);
    printf("ready to note-off... (type RETURN):");
    fgets(line, STRING_MAX, stdin);
    buffer[0].timestamp = TIME_PROC(TIME_INFO);
    buffer[0].message = Pm_Message(0x90, 60, 0);
    Pm_Write(midi, buffer, 1);

    /* output short note on/off w/latency offset; hold until user prompts */
    printf("ready to note-on (short form)... (type RETURN):");
    fgets(line, STRING_MAX, stdin);
    Pm_WriteShort(midi, TIME_PROC(TIME_INFO),
                  Pm_Message(0x90, 60, 100));
    printf("ready to note-off (short form)... (type RETURN):");
    fgets(line, STRING_MAX, stdin);
    Pm_WriteShort(midi, TIME_PROC(TIME_INFO),
                  Pm_Message(0x90, 60, 0));

    /* output several note on/offs to test timing. 
       Should be 1s between notes */
    printf("chord will arpeggiate if latency > 0\n");
    printf("ready to chord-on/chord-off... (type RETURN):");
    fgets(line, STRING_MAX, stdin);
    timestamp = TIME_PROC(TIME_INFO);
    for (i = 0; i < chord_size; i++) {
        buffer[i].timestamp = timestamp + 1000 * i;
        buffer[i].message = Pm_Message(0x90, chord[i], 100);
    }
    Pm_Write(midi, buffer, chord_size);

    off_time = timestamp + 1000 + chord_size * 1000; 
    while (TIME_PROC(TIME_INFO) < off_time) 
		/* busy wait */;
    for (i = 0; i < chord_size; i++) {
        buffer[i].timestamp = timestamp + 1000 * i;
        buffer[i].message = Pm_Message(0x90, chord[i], 0);
    }
    Pm_Write(midi, buffer, chord_size);    

    /* close device (this not explicitly needed in most implementations) */
    printf("ready to close and terminate... (type RETURN):");
    fgets(line, STRING_MAX, stdin);
	
    Pm_Close(midi);
    Pm_Terminate();
    printf("done closing and terminating...\n");
}